

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O0

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::create_initial_page
          (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  uintptr_t uVar1;
  memory_order mVar2;
  __int_type _Var3;
  __atomic_base<unsigned_long> _Var4;
  atomic<unsigned_long> *paVar5;
  bool bVar6;
  __atomic_base<unsigned_long> local_d8;
  uintptr_t tail;
  uintptr_t initial_page;
  uintptr_t first_page;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *pLStack_b8;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *this_local;
  undefined4 local_a4;
  uintptr_t local_a0;
  __atomic_base<unsigned_long> *local_98;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *local_90;
  undefined4 local_84;
  uintptr_t local_80;
  uintptr_t *local_78;
  atomic<unsigned_long> *local_70;
  bool local_61;
  uintptr_t local_60;
  memory_order local_58;
  undefined4 local_54;
  uintptr_t local_50;
  uintptr_t *local_48;
  atomic<unsigned_long> *local_40;
  
  first_page._4_4_ = i_progress_guarantee;
  pLStack_b8 = this;
  local_60 = create_page(this,i_progress_guarantee);
  if (local_60 == 0) {
    this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                  *)0x0;
  }
  else {
    tail = 0;
    paVar5 = &this->m_initial_page;
    local_84 = 5;
    initial_page = local_60;
    local_80 = local_60;
    local_78 = &tail;
    local_70 = paVar5;
    local_58 = std::__cmpexch_failure_order(memory_order_seq_cst);
    local_54 = 5;
    switch(0x219a9c2) {
    default:
      if (local_58 - memory_order_consume < 2) {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      else if (local_58 == memory_order_seq_cst) {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      else {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      break;
    case 2:
      if (local_58 - memory_order_consume < 2) {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      else if (local_58 == memory_order_seq_cst) {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      else {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      break;
    case 3:
      if (local_58 - memory_order_consume < 2) {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      else if (local_58 == memory_order_seq_cst) {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      else {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      break;
    case 4:
      if (local_58 - memory_order_consume < 2) {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      else if (local_58 == memory_order_seq_cst) {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
      else {
        LOCK();
        _Var3 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        local_61 = tail == _Var3;
        if (local_61) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = local_60;
          _Var3 = tail;
        }
        UNLOCK();
        if (!local_61) {
          tail = _Var3;
        }
      }
    }
    local_50 = local_60;
    local_48 = &tail;
    local_40 = paVar5;
    if (local_61 == false) {
      discard_created_page(this,initial_page);
    }
    else {
      tail = initial_page;
    }
    uVar1 = tail;
    local_d8._M_i = 0xffc0;
    local_98 = &local_d8;
    local_a0 = tail;
    local_a4 = 5;
    local_90 = this;
    mVar2 = std::__cmpexch_failure_order(memory_order_seq_cst);
    switch(0x219b07b) {
    default:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      else {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      break;
    case 2:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      else {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      break;
    case 3:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      else {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      break;
    case 4:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
      else {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = local_d8._M_i == _Var4._M_i;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_d8._M_i;
        }
        UNLOCK();
        if (!bVar6) {
          local_d8._M_i = _Var4._M_i;
        }
      }
    }
    if (bVar6) {
      this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                    *)tail;
    }
    else {
      this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                    *)local_d8._M_i;
    }
  }
  return (uintptr_t)this_local;
}

Assistant:

DENSITY_NO_INLINE uintptr_t
                              create_initial_page(LfQueue_ProgressGuarantee const i_progress_guarantee)
            {
                // m_initial_page = initial_page = create_page()
                uintptr_t const first_page = create_page(i_progress_guarantee);
                if (first_page == 0)
                {
                    return 0;
                }

                /* note: in case of failure of the following CAS we do not give in even if we are wait-free,
                    because this is a one-shot operation, so we can't possibly stick in a loop. */
                uintptr_t initial_page = 0;
                if (m_initial_page.compare_exchange_strong(initial_page, first_page))
                {
                    initial_page = first_page;
                }
                else
                {
                    discard_created_page(first_page);
                }

                // m_tail = initial_page;
                auto tail = s_invalid_control_block;
                if (m_tail.compare_exchange_strong(tail, initial_page))
                {
                    return initial_page;
                }
                else
                {
                    return tail;
                }
            }